

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cJSON.c
# Opt level: O1

void cJSON_ReplaceItemInObject(cJSON *object,char *string,cJSON *newitem)

{
  int iVar1;
  size_t sVar2;
  char *__dest;
  int which;
  cJSON *pcVar3;
  
  pcVar3 = object->child;
  if (pcVar3 != (cJSON *)0x0) {
    which = 0;
    do {
      iVar1 = cJSON_strcasecmp(pcVar3->string,string);
      if (iVar1 == 0) {
        sVar2 = strlen(string);
        __dest = (char *)(*cJSON_malloc)(sVar2 + 1);
        if (__dest == (char *)0x0) {
          __dest = (char *)0x0;
        }
        else {
          memcpy(__dest,string,sVar2 + 1);
        }
        newitem->string = __dest;
        cJSON_ReplaceItemInArray(object,which,newitem);
        return;
      }
      which = which + 1;
      pcVar3 = pcVar3->next;
    } while (pcVar3 != (cJSON *)0x0);
  }
  return;
}

Assistant:

void   cJSON_ReplaceItemInObject(cJSON *object,const char *string,cJSON *newitem){int i=0;cJSON *c=object->child;while(c && cJSON_strcasecmp(c->string,string))i++,c=c->next;if(c){newitem->string=cJSON_strdup(string);cJSON_ReplaceItemInArray(object,i,newitem);}}